

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O1

vector<duckdb::ColumnBinding,_true> *
duckdb::LogicalOperator::GenerateColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,idx_t table_idx,
          idx_t column_count)

{
  unsigned_long local_30;
  idx_t local_28;
  
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = table_idx;
  ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::reserve
            (&__return_storage_ptr__->
              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,
             column_count);
  local_30 = 0;
  if (column_count != 0) {
    do {
      ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
      emplace_back<unsigned_long&,unsigned_long&>
                ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                 __return_storage_ptr__,&local_28,&local_30);
      local_30 = local_30 + 1;
    } while (local_30 < column_count);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalOperator::GenerateColumnBindings(idx_t table_idx, idx_t column_count) {
	vector<ColumnBinding> result;
	result.reserve(column_count);
	for (idx_t i = 0; i < column_count; i++) {
		result.emplace_back(table_idx, i);
	}
	return result;
}